

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Bounds2f __thiscall
pbrt::RealisticCamera::BoundExitPupil(RealisticCamera *this,Float filmX0,Float filmX1)

{
  Vector2<float> v;
  Vector3f d;
  Point3<float> p;
  Point2<float> p2;
  Point2<float> p1;
  Point2<float> p_00;
  Point3f o;
  Bounds2f BVar1;
  bool bVar2;
  Bounds2<float> *in_RDI;
  Float in_XMM0_Da;
  Float FVar3;
  Float x;
  ulong extraout_XMM0_Qb;
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Float in_XMM1_Da;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Vector3<float> VVar12;
  Bounds2<float> BVar13;
  Ray *in_stack_000000a8;
  Ray *in_stack_000000b0;
  RealisticCamera *in_stack_000000b8;
  Point3f pRear;
  Float u [2];
  Point3f pFilm;
  int i;
  Bounds2f projRearBounds;
  Float rearRadius;
  int nSamples;
  Bounds2f pupilBounds;
  Bounds2<float> *in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  Float in_stack_fffffffffffffea4;
  uint in_stack_fffffffffffffeac;
  uint uVar14;
  float in_stack_fffffffffffffebc;
  Bounds2<float> *in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  LogLevel in_stack_ffffffffffffff04;
  Point2<float> local_74;
  char *local_58;
  int local_4c;
  Float local_38;
  Float local_34;
  Float local_30;
  Float local_2c;
  Bounds2<float> local_10;
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  
  Bounds2<float>::Bounds2(in_RDI);
  RearElementRadius((RealisticCamera *)0x86c7e0);
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),SUB84(in_stack_fffffffffffffe98,0));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),SUB84(in_stack_fffffffffffffe98,0));
  p1.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffed4;
  p1.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffed0;
  p2.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffecc;
  p2.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffec8;
  Bounds2<float>::Bounds2(in_stack_fffffffffffffec0,p1,p2);
  for (local_4c = 0; local_4c < 0x100000; local_4c = local_4c + 1) {
    Lerp(((float)local_4c + 0.5) * 9.536743e-07,in_XMM0_Da,in_XMM1_Da);
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),SUB84(in_stack_fffffffffffffe98,0),
               0.0);
    FVar3 = RadicalInverse((int)in_stack_fffffffffffffed4,
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    x = RadicalInverse((int)in_stack_fffffffffffffed4,
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    FVar3 = Lerp(FVar3,local_38,local_30);
    in_stack_fffffffffffffea4 = Lerp(x,local_34,local_2c);
    LensRearZ((RealisticCamera *)0x86c946);
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),SUB84(in_stack_fffffffffffffe98,0),
               0.0);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),SUB84(in_stack_fffffffffffffe98,0))
    ;
    bVar2 = Inside<float>(local_74,&local_10);
    uVar14 = in_stack_fffffffffffffeac & 0xffffff;
    if (!bVar2) {
      auVar8 = ZEXT856(0);
      p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffec8;
      p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffec0;
      VVar12 = Point3<float>::operator-
                         ((Point3<float> *)
                          (CONCAT44(in_stack_fffffffffffffeac,FVar3) & 0xffffffffffffff),p);
      auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar4._8_56_ = auVar8;
      in_stack_fffffffffffffee8 = (char *)vmovlpd_avx(auVar4._0_16_);
      Medium::TaggedPointer
                ((Medium *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      o.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffee0;
      o.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffed8.x;
      o.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffed8.y;
      d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffffec0;
      d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffebc;
      in_stack_fffffffffffffef8 = local_58;
      Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),o,d,
               (Float)((ulong)in_stack_fffffffffffffe98 >> 0x20),(Medium *)0x86cab8);
      FVar3 = TraceLensesFromFilm(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
      uVar14 = CONCAT13(FVar3 != 0.0,(int3)uVar14);
    }
    in_stack_fffffffffffffeac = uVar14;
    if ((char)(in_stack_fffffffffffffeac >> 0x18) != '\0') {
      auVar11 = (undefined1  [56])0x0;
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                 SUB84(in_stack_fffffffffffffe98,0));
      auVar8 = ZEXT856(0);
      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffed4;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffed0;
      BVar13 = Union<float>((Bounds2<float> *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),p_00);
      auVar9._0_8_ = BVar13.pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar9._8_56_ = auVar11;
      auVar5._0_8_ = BVar13.pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar5._8_56_ = auVar8;
      in_stack_fffffffffffffed8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar5._0_16_);
      local_10.pMax.super_Tuple2<pbrt::Point2,_float> =
           (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
      in_stack_fffffffffffffee0 = local_10.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      in_stack_fffffffffffffee4 = local_10.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_10.pMin.super_Tuple2<pbrt::Point2,_float> = in_stack_fffffffffffffed8;
    }
  }
  bVar2 = Bounds2<float>::IsDegenerate(&local_10);
  if (bVar2) {
    if (logging::logLevel < 1) {
      Log<float&,float&>(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                         (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (float *)in_stack_fffffffffffffed8);
    }
  }
  else {
    auVar6._0_8_ = Bounds2<float>::Diagonal(in_stack_fffffffffffffe98);
    auVar6._8_56_ = extraout_var;
    vmovlpd_avx(auVar6._0_16_);
    v.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffea4;
    v.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffea0;
    Length<float>(v);
    std::sqrt<int>(0);
    auVar11 = ZEXT856(extraout_XMM0_Qb);
    auVar8 = ZEXT856(0);
    BVar13 = Expand<float,double>
                       ((Bounds2<float> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    auVar10._0_8_ = BVar13.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar10._8_56_ = auVar11;
    auVar7._0_8_ = BVar13.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar7._8_56_ = auVar8;
    local_10.pMin.super_Tuple2<pbrt::Point2,_float> =
         (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7._0_16_);
    local_10.pMax.super_Tuple2<pbrt::Point2,_float> =
         (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar10._0_16_);
  }
  BVar1.pMax.super_Tuple2<pbrt::Point2,_float> = local_10.pMax.super_Tuple2<pbrt::Point2,_float>;
  BVar1.pMin.super_Tuple2<pbrt::Point2,_float> = local_10.pMin.super_Tuple2<pbrt::Point2,_float>;
  return BVar1;
}

Assistant:

Bounds2f RealisticCamera::BoundExitPupil(Float filmX0, Float filmX1) const {
    Bounds2f pupilBounds;
    // Sample a collection of points on the rear lens to find exit pupil
    const int nSamples = 1024 * 1024;
    // Compute bounding box of projection of rear element on sampling plane
    Float rearRadius = RearElementRadius();
    Bounds2f projRearBounds(Point2f(-1.5f * rearRadius, -1.5f * rearRadius),
                            Point2f(1.5f * rearRadius, 1.5f * rearRadius));

    for (int i = 0; i < nSamples; ++i) {
        // Find location of sample points on $x$ segment and rear lens element
        Point3f pFilm(Lerp((i + 0.5f) / nSamples, filmX0, filmX1), 0, 0);
        Float u[2] = {RadicalInverse(0, i), RadicalInverse(1, i)};
        Point3f pRear(Lerp(u[0], projRearBounds.pMin.x, projRearBounds.pMax.x),
                      Lerp(u[1], projRearBounds.pMin.y, projRearBounds.pMax.y),
                      LensRearZ());

        // Expand pupil bounds if ray makes it through the lens system
        if (!Inside(Point2f(pRear.x, pRear.y), pupilBounds) &&
            TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr))
            pupilBounds = Union(pupilBounds, Point2f(pRear.x, pRear.y));
    }

    // Return degenerate bounds if no rays made it through the lens system
    if (pupilBounds.IsDegenerate()) {
        LOG_VERBOSE("Unable to find exit pupil in x = [%f,%f] on film.", filmX0, filmX1);
        return pupilBounds;
    }

    // Expand bounds to account for sample spacing
    pupilBounds =
        Expand(pupilBounds, 2 * Length(projRearBounds.Diagonal()) / std::sqrt(nSamples));

    return pupilBounds;
}